

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

Value * __thiscall wabt::interp::Thread::Pop(Thread *this)

{
  pointer puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  pointer pVVar4;
  Value *in_RDI;
  ulong uVar5;
  
  puVar1 = (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start == puVar1) {
    pVVar4 = (this->values_).
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    pVVar4 = (this->values_).
             super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = ((long)pVVar4 -
             (long)(this->values_).
                   super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if (uVar5 < puVar1[-1] || uVar5 - puVar1[-1] == 0) {
      (this->refs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1 + -1;
    }
  }
  uVar3 = *(undefined4 *)&pVVar4[-1].field_0x14;
  in_RDI->type = (ValueType)pVVar4[-1].type.enum_;
  *(undefined4 *)&in_RDI->field_0x14 = uVar3;
  uVar2 = *(undefined8 *)((long)&pVVar4[-1].field_0 + 8);
  (in_RDI->field_0).i64_ = pVVar4[-1].field_0.i64_;
  *(undefined8 *)((long)&in_RDI->field_0 + 8) = uVar2;
  (this->values_).super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar4 + -1;
  return in_RDI;
}

Assistant:

Value Thread::Pop() {
  if (!refs_.empty() && refs_.back() >= values_.size()) {
    refs_.pop_back();
  }
  auto value = values_.back();
  values_.pop_back();
  return value;
}